

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O0

int field_with_index(char *opcode_bits,int index)

{
  BOOL BVar1;
  int local_28;
  int local_24;
  int i;
  PatternRange range;
  int index_local;
  char *opcode_bits_local;
  
  local_28 = 1;
  range.index = index;
  unique0x10000036 = opcode_bits;
  while( true ) {
    BVar1 = pattern_range(stack0xffffffffffffffe8,local_28,(PatternRange *)&stack0xffffffffffffffdc)
    ;
    if (BVar1 == FALSE) {
      return 0;
    }
    if (local_24 == range.index) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

int
field_with_index (const char *opcode_bits, int index)
{
  PatternRange range;
  int i;

  for (i = 1; pattern_range (opcode_bits, i, &range); i++)
    {
      if (range.index == index)
	return i;
    }
  return 0;
}